

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapidxml_print.hpp
# Opt level: O2

back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
 rapidxml::internal::print_attributes<std::back_insert_iterator<std::__cxx11::string>,char>
           (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            out,xml_node<char> *node,int flags)

{
  xml_node<char> *pxVar1;
  bool bVar2;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  out_00;
  xml_node<char> *pxVar3;
  size_t sVar4;
  char *pcVar5;
  
  pxVar1 = (xml_node<char> *)node->m_first_attribute;
  while (pxVar3 = pxVar1, pxVar3 != (xml_node<char> *)0x0) {
    std::__cxx11::string::push_back((char)out.container);
    pcVar5 = (pxVar3->super_xml_base<char>).m_name;
    if (pcVar5 == (char *)0x0) {
      pcVar5 = &xml_base<char>::nullstr()::zero;
      sVar4 = 0;
    }
    else {
      sVar4 = (pxVar3->super_xml_base<char>).m_name_size;
    }
    out_00 = copy_chars<std::back_insert_iterator<std::__cxx11::string>,char>
                       (pcVar5,pcVar5 + sVar4,out);
    std::__cxx11::string::push_back((char)out_00.container);
    pcVar5 = (pxVar3->super_xml_base<char>).m_value;
    if (pcVar5 == (char *)0x0) {
      pcVar5 = &xml_base<char>::nullstr()::zero;
      sVar4 = 0;
    }
    else {
      sVar4 = (pxVar3->super_xml_base<char>).m_value_size;
    }
    bVar2 = find_char<char,____>(pcVar5,pcVar5 + sVar4);
    std::__cxx11::string::push_back((char)out_00.container);
    pcVar5 = (pxVar3->super_xml_base<char>).m_value;
    if (pcVar5 == (char *)0x0) {
      pcVar5 = &xml_base<char>::nullstr()::zero;
      sVar4 = 0;
    }
    else {
      sVar4 = (pxVar3->super_xml_base<char>).m_value_size;
    }
    out = copy_and_expand_chars<std::back_insert_iterator<std::__cxx11::string>,char>
                    (pcVar5,pcVar5 + sVar4,!bVar2 * '\x05' + '\"',out_00);
    std::__cxx11::string::push_back((char)out.container);
    pxVar1 = (pxVar3->super_xml_base<char>).m_parent;
    if (pxVar1 != (xml_node<char> *)0x0) {
      pxVar1 = pxVar3->m_first_node;
    }
  }
  return (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          )out.container;
}

Assistant:

inline OutIt print_attributes(OutIt out, const xml_node<Ch> *node, int flags)
        {
            for (xml_attribute<Ch> *attribute = node->first_attribute(); attribute; attribute = attribute->next_attribute())
            {
                if (attribute->name() && attribute->value())
                {
                    // Print attribute name
                    *out = Ch(' '), ++out;
                    out = copy_chars(attribute->name(), attribute->name() + attribute->name_size(), out);
                    *out = Ch('='), ++out;
                    // Print attribute value using appropriate quote type
                    if (find_char<Ch, Ch('"')>(attribute->value(), attribute->value() + attribute->value_size()))
                    {
                        *out = Ch('\''), ++out;
                        out = copy_and_expand_chars(attribute->value(), attribute->value() + attribute->value_size(), Ch('"'), out);
                        *out = Ch('\''), ++out;
                    }
                    else
                    {
                        *out = Ch('"'), ++out;
                        out = copy_and_expand_chars(attribute->value(), attribute->value() + attribute->value_size(), Ch('\''), out);
                        *out = Ch('"'), ++out;
                    }
                }
            }
            return out;
        }